

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall Client::OnConnect(Client *this,Handle *handle,uint32_t error)

{
  __int_type _Var1;
  element_type *peVar2;
  ostream *poVar3;
  Session *this_00;
  mapped_type *ppSVar4;
  __shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  if (error != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout," something error while connect. error :  ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    return;
  }
  LOCK();
  (this->_num_connected).super___atomic_base<unsigned_int>._M_i =
       (this->_num_connected).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  _Var1 = (this->_num_connected).super___atomic_base<unsigned_int>._M_i;
  if (_Var1 == this->_session_count) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_Var1);
    poVar3 = std::operator<<(poVar3," sessions all connected");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  this_00 = (Session *)operator_new(0x18);
  this_00->_owner = this;
  this_00->_bytes_read = 0;
  this_00->_messages_read = 0;
  peVar2 = (handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar2->_vptr_CNSocket[9])(peVar2,this_00);
  std::__shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,&handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>);
  Session::OnConnection(this_00,(Handle *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  std::mutex::lock(&this->_mutex);
  ppSVar4 = std::__detail::
            _Map_base<std::shared_ptr<cppnet::CNSocket>,_std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>,_std::allocator<std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<cppnet::CNSocket>_>,_std::hash<std::shared_ptr<cppnet::CNSocket>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<std::shared_ptr<cppnet::CNSocket>,_std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>,_std::allocator<std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<cppnet::CNSocket>_>,_std::hash<std::shared_ptr<cppnet::CNSocket>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->_sessions,handle);
  *ppSVar4 = this_00;
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return;
}

Assistant:

void OnConnect(cppnet::Handle handle, uint32_t error) {
        if (error == cppnet::CEC_SUCCESS) {
            _num_connected++;
            if (_num_connected.load() == _session_count) {
                std::cout << _session_count << " sessions all connected" << std::endl;
            }
            auto session = new Session(this);
            handle->SetContext(session);
            session->OnConnection(handle);

            std::lock_guard<std::mutex> lock(_mutex);
            _sessions[handle] = session;

        } else {
            std::cout << " something error while connect. error :  " << error << std::endl;
        }
    }